

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O2

void my_numbox_dialog(t_my_numbox *x,t_symbol *s,int argc,t_atom *argv)

{
  _glist *canvas;
  int iVar1;
  t_symbol *s_00;
  t_atomtype tVar2;
  t_float tVar3;
  t_float tVar4;
  t_float tVar5;
  t_float tVar6;
  t_float tVar7;
  t_float tVar8;
  ulong uVar9;
  t_symbol *srl [3];
  t_atom undo [18];
  
  tVar3 = atom_getfloatarg(0,argc,argv);
  tVar2 = A_FLOAT;
  tVar4 = atom_getfloatarg(1,argc,argv);
  tVar5 = atom_getfloatarg(2,argc,argv);
  tVar6 = atom_getfloatarg(3,argc,argv);
  tVar7 = atom_getfloatarg(4,argc,argv);
  tVar8 = atom_getfloatarg(6,argc,argv);
  iemgui_setdialogatoms(&x->x_gui,0x12,undo);
  undo[0].a_w._0_4_ = (undefined4)x->x_numwidth;
  undo[2].a_w._0_4_ = (undefined4)x->x_min;
  undo[3].a_w._0_4_ = (undefined4)x->x_max;
  undo[4].a_w._0_4_ = (undefined4)x->x_lin0_log1;
  undo[6].a_w._0_4_ = (undefined4)x->x_log_height;
  canvas = (x->x_gui).x_glist;
  undo[0].a_type = tVar2;
  undo[2].a_type = tVar2;
  undo[3].a_type = tVar2;
  undo[4].a_type = tVar2;
  undo[6].a_type = tVar2;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,undo,argc,argv);
  x->x_lin0_log1 = (uint)((int)tVar7 != 0);
  iemgui_dialog(&x->x_gui,srl,argc,argv);
  iVar1 = 8;
  if (8 < (int)tVar4) {
    iVar1 = (int)tVar4;
  }
  (x->x_gui).x_h = iVar1 * ((x->x_gui).x_glist)->gl_zoom;
  uVar9 = CONCAT44(-(uint)(10 < (int)tVar8),-(uint)(1 < (int)tVar3));
  uVar9 = ~uVar9 & 0xa00000001 | CONCAT44((int)tVar8,(int)tVar3) & uVar9;
  x->x_numwidth = (int)uVar9;
  x->x_log_height = (int)(uVar9 >> 0x20);
  my_numbox_calc_fontwidth(x);
  my_numbox_check_minmax(x,(double)tVar5,(double)tVar6);
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void my_numbox_dialog(t_my_numbox *x, t_symbol *s, int argc,
    t_atom *argv)
{
    t_symbol *srl[3];
    int w = (int)atom_getfloatarg(0, argc, argv);
    int h = (int)atom_getfloatarg(1, argc, argv);
    double min = (double)atom_getfloatarg(2, argc, argv);
    double max = (double)atom_getfloatarg(3, argc, argv);
    int lilo = (int)atom_getfloatarg(4, argc, argv);
    int log_height = (int)atom_getfloatarg(6, argc, argv);
    int sr_flags;
    t_atom undo[18];
    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT(undo+0, x->x_numwidth);
    SETFLOAT(undo+2, x->x_min);
    SETFLOAT(undo+3, x->x_max);
    SETFLOAT(undo+4, x->x_lin0_log1);
    SETFLOAT(undo+6, x->x_log_height);

    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    if(lilo != 0) lilo = 1;
    x->x_lin0_log1 = lilo;
    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);
    if(w < MINDIGITS)
        w = MINDIGITS;
    x->x_numwidth = w;
    if(h < IEM_GUI_MINSIZE)
        h = IEM_GUI_MINSIZE;
    x->x_gui.x_h = h * IEMGUI_ZOOM(x);
    if(log_height < 10)
        log_height = 10;
    x->x_log_height = log_height;
    my_numbox_calc_fontwidth(x);
    /*if(my_numbox_check_minmax(x, min, max))
     my_numbox_bang(x);*/
    my_numbox_check_minmax(x, min, max);
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
    iemgui_size(x, &x->x_gui);
}